

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable_destructive_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
::advance_past_deleted
          (sparse_hashtable_destructive_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
           *this)

{
  nonempty_iterator *pppVar1;
  sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
  *psVar2;
  sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
  *psVar3;
  sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
  *psVar4;
  bool bVar5;
  
  while ((((((this->pos).row_begin._M_current != (this->end).row_begin._M_current ||
            (psVar2 = (this->pos).row_end._M_current, psVar2 != (this->end).row_end._M_current)) ||
           (psVar3 = (this->pos).row_current._M_current,
           psVar3 != (this->end).row_current._M_current)) ||
          ((psVar3 != psVar2 && ((this->pos).col_current != (this->end).col_current)))) &&
         (psVar4 = this->ht, psVar4->num_deleted != 0))) {
    bVar5 = Hasher::operator()(&(psVar4->key_info).super_Hasher,&(psVar4->key_info).delkey,
                               &((this->pos).col_current)->first);
    if (!bVar5) {
      return;
    }
    pppVar1 = &(this->pos).col_current;
    *pppVar1 = *pppVar1 + 1;
    destructive_two_d_iterator<std::vector<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>_>_>_>
    ::advance_past_end(&this->pos);
  }
  return;
}

Assistant:

void advance_past_deleted() {
    while (pos != end && ht->test_deleted(*this)) ++pos;
  }